

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

size_t license::mstrlcpy(char *dst,char *src,size_t n)

{
  bool bVar1;
  char *local_38;
  char *ps;
  char *pd;
  size_t n_orig;
  size_t n_local;
  char *src_local;
  char *dst_local;
  
  n_orig = n;
  if (n != 0) {
    n_orig = n - 1;
    local_38 = src;
    ps = dst;
    while( true ) {
      bVar1 = false;
      if (n_orig != 0) {
        bVar1 = *local_38 != '\0';
      }
      if (!bVar1) break;
      *ps = *local_38;
      n_orig = n_orig - 1;
      ps = ps + 1;
      local_38 = local_38 + 1;
    }
    *ps = '\0';
  }
  return n - n_orig;
}

Assistant:

size_t mstrlcpy(char *dst, const char *src, size_t n) {
	size_t n_orig = n;
	if (n > 0) {
		char *pd;
		const char *ps;

		for (--n, pd = dst, ps = src; n > 0 && *ps != '\0'; --n, ++pd, ++ps) *pd = *ps;

		*pd = '\0';
	}

	return n_orig - n;
}